

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

void __thiscall Inferences::ContextSubsetReplacement::stepIteration(ContextSubsetReplacement *this)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  uint i;
  uint local_c;
  
  local_c = 0;
  do {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xa0));
    if (sVar2 <= local_c) {
      *(undefined1 *)(in_RDI + 0xf1) = 1;
      return;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xb8),
                        (ulong)local_c);
    if (*pvVar3 <= *(uint *)(in_RDI + 0xe8)) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xa0),
                          (ulong)local_c);
      *pvVar3 = *pvVar3 + 1;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xa0),
                          (ulong)local_c);
      uVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xb8),
                          (ulong)local_c);
      if (uVar1 < *pvVar3) {
        return;
      }
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xa0),
                          (ulong)local_c);
      *pvVar3 = 1;
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void ContextSubsetReplacement::stepIteration()
{
  for (unsigned i = 0; i < _iteration.size(); i++) {
    if (_maxIterations[i] > _maxOccurrences) {
      continue;
    }
    _iteration[i]++;
    if (_iteration[i] < _maxIterations[i]) {
      return;
    } else {
      _iteration[i] = 1;
    }
  }
  _done = true;
}